

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ClassNameSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::ClassNameSyntax,slang::syntax::ClassNameSyntax_const&>
          (BumpAllocator *this,ClassNameSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  ParameterValueAssignmentSyntax *pPVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  ClassNameSyntax *pCVar10;
  
  pCVar10 = (ClassNameSyntax *)allocate(this,0x30,8);
  uVar5 = *(undefined4 *)&(args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4
  ;
  pSVar1 = (args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.parent;
  pSVar2 = (args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode;
  TVar6 = (args->identifier).kind;
  uVar7 = (args->identifier).field_0x2;
  NVar8.raw = (args->identifier).numFlags.raw;
  uVar9 = (args->identifier).rawLen;
  pIVar3 = (args->identifier).info;
  pPVar4 = (args->parameters).ptr;
  (pCVar10->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.kind =
       (args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar10->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4 =
       uVar5;
  (pCVar10->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = pSVar1;
  (pCVar10->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode = pSVar2;
  (pCVar10->identifier).kind = TVar6;
  (pCVar10->identifier).field_0x2 = uVar7;
  (pCVar10->identifier).numFlags = (NumericTokenFlags)NVar8.raw;
  (pCVar10->identifier).rawLen = uVar9;
  (pCVar10->identifier).info = pIVar3;
  (pCVar10->parameters).ptr = pPVar4;
  return pCVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }